

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong __thiscall mkvparser::Block::GetTimeCode(Block *this,Cluster *pCluster)

{
  longlong lVar1;
  longlong tc;
  longlong tc0;
  Cluster *pCluster_local;
  Block *this_local;
  
  if (pCluster == (Cluster *)0x0) {
    this_local = (Block *)(long)this->m_timecode;
  }
  else {
    lVar1 = Cluster::GetTimeCode(pCluster);
    if (lVar1 < 0) {
      __assert_fail("tc0 >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1f60,"long long mkvparser::Block::GetTimeCode(const Cluster *) const");
    }
    if ((lVar1 < 0) || (0x7fffffffffffffff - lVar1 < (long)this->m_timecode)) {
      this_local = (Block *)0xffffffffffffffff;
    }
    else {
      this_local = (Block *)(lVar1 + this->m_timecode);
    }
  }
  return (longlong)this_local;
}

Assistant:

long long Block::GetTimeCode(const Cluster* pCluster) const {
  if (pCluster == 0)
    return m_timecode;

  const long long tc0 = pCluster->GetTimeCode();
  assert(tc0 >= 0);

  // Check if tc0 + m_timecode would overflow.
  if (tc0 < 0 || LLONG_MAX - tc0 < m_timecode) {
    return -1;
  }

  const long long tc = tc0 + m_timecode;

  return tc;  // unscaled timecode units
}